

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PMP_Multilinear_64.h
# Opt level: O0

void __thiscall
PMP_Multilinear_Hasher_64::randomize
          (PMP_Multilinear_Hasher_64 *this,UniformRandomNumberGenerator *rng)

{
  ulong uVar1;
  uint uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  void *pvVar5;
  undefined8 *in_RSI;
  long in_RDI;
  bool bVar6;
  uint64_t rv;
  uint64_t csl;
  int j;
  int i;
  random_data_for_PMPML_64 *temp_curr_rd;
  int local_20;
  int local_1c;
  
  pvVar5 = operator_new__(0x2100,0x20);
  for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 0x80; local_20 = local_20 + 1) {
      *(undefined8 *)((long)pvVar5 + (long)local_1c * 0x420 + 8) = 0;
      *(undefined8 *)((long)pvVar5 + (long)local_1c * 0x420 + 0x10) = 0;
      do {
        uVar2 = (**(code **)*in_RSI)();
        *(ulong *)((long)pvVar5 + (long)local_20 * 8 + (long)local_1c * 0x420 + 0x20) = (ulong)uVar2
        ;
        *(long *)((long)pvVar5 + (long)local_20 * 8 + (long)local_1c * 0x420 + 0x20) =
             *(long *)((long)pvVar5 + (long)local_20 * 8 + (long)local_1c * 0x420 + 0x20) << 0x20;
        uVar2 = (**(code **)*in_RSI)();
        *(ulong *)((long)pvVar5 + (long)local_20 * 8 + (long)local_1c * 0x420 + 0x20) =
             (ulong)uVar2 |
             *(ulong *)((long)pvVar5 + (long)local_20 * 8 + (long)local_1c * 0x420 + 0x20);
        if (local_1c < 1) {
          bVar6 = *(long *)((long)pvVar5 + (long)local_20 * 8 + (long)local_1c * 0x420 + 0x20) != 0;
        }
        else {
          bVar6 = false;
          if (*(long *)((long)pvVar5 + (long)local_20 * 8 + (long)local_1c * 0x420 + 0x20) != 0) {
            bVar6 = *(ulong *)((long)pvVar5 + (long)local_20 * 8 + (long)local_1c * 0x420 + 0x20) <
                    0xfffffffffffffff5;
          }
        }
      } while (!bVar6);
      uVar1 = *(ulong *)((long)pvVar5 + (long)local_1c * 0x420 + 8);
      *(long *)((long)pvVar5 + (long)local_1c * 0x420 + 8) =
           *(long *)((long)pvVar5 + (long)local_20 * 8 + (long)local_1c * 0x420 + 0x20) +
           *(long *)((long)pvVar5 + (long)local_1c * 0x420 + 8);
      if (*(ulong *)((long)pvVar5 + (long)local_1c * 0x420 + 8) < uVar1) {
        *(long *)((long)pvVar5 + (long)local_1c * 0x420 + 0x10) =
             *(long *)((long)pvVar5 + (long)local_1c * 0x420 + 0x10) + 1;
      }
    }
  }
  for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
    uVar3 = (**(code **)*in_RSI)();
    uVar4 = (**(code **)*in_RSI)();
    *(ulong *)((long)pvVar5 + (long)local_1c * 0x420) = CONCAT44(uVar3,uVar4);
  }
  if (*(random_data_for_PMPML_64 **)(in_RDI + 8) == rd_for_PMPML_64) {
    *(void **)(in_RDI + 8) = pvVar5;
  }
  else {
    if ((*(long *)(in_RDI + 8) != 0) && (*(long *)(in_RDI + 8) != 0)) {
      operator_delete__(*(long *)(in_RDI + 8),0x20);
    }
    *(void **)(in_RDI + 8) = pvVar5;
  }
  return;
}

Assistant:

void randomize( UniformRandomNumberGenerator& rng )
  {
    random_data_for_PMPML_64 * temp_curr_rd = new random_data_for_PMPML_64[ PMPML_LEVELS_64 ];

	int i, j;
	for ( i=0; i<PMPML_LEVELS_64; i++ )
	{
		for ( j=0; j<PMPML_CHUNK_SIZE_64; j++ )
		{
			temp_curr_rd[ i ].cachedSumLow = 0;
			temp_curr_rd[ i ].cachedSumHigh = 0;
			do
			{
				temp_curr_rd[ i ].random_coeff[ j ] = rng.rand();
				temp_curr_rd[ i ].random_coeff[ j ] <<= 32;
				temp_curr_rd[ i ].random_coeff[ j ] |= rng.rand();
			}
			while ( !IS_VALID_COEFFICIENT_64( temp_curr_rd[ i ].random_coeff[ j ], i ) );
			uint64_t csl = temp_curr_rd[ i ].cachedSumLow;
			temp_curr_rd[ i ].cachedSumLow += temp_curr_rd[ i ].random_coeff[ j ];
			if ( temp_curr_rd[ i ].cachedSumLow < csl )
				temp_curr_rd[ i ].cachedSumHigh += 1;
		}
	}

	for ( i=0; i<PMPML_LEVELS_64; i++ )
	{
		uint64_t rv = rng.rand();
		rv <<= 32;
		rv += rng.rand();
		temp_curr_rd[ i ].const_term = rv;
	}

	if ( curr_rd == rd_for_PMPML_64 )
		curr_rd = temp_curr_rd;
	else
	{
		if ( curr_rd != NULL )
			delete [] curr_rd;
		curr_rd = temp_curr_rd;
	}
  }